

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int64_t ucstrTextLength(UText *ut)

{
  UChar *str;
  UText *ut_local;
  
  if (ut->a < 0) {
    while (*(short *)((long)ut->context + ut->chunkNativeLimit * 2) != 0) {
      ut->chunkNativeLimit = ut->chunkNativeLimit + 1;
    }
    ut->a = ut->chunkNativeLimit;
    ut->chunkLength = (int32_t)ut->chunkNativeLimit;
    ut->nativeIndexingLimit = ut->chunkLength;
    ut->providerProperties = ut->providerProperties & 0xfffffffd;
  }
  return ut->a;
}

Assistant:

static int64_t U_CALLCONV
ucstrTextLength(UText *ut) {
    if (ut->a < 0) {
        // null terminated, we don't yet know the length.  Scan for it.
        //    Access is not convenient for doing this
        //    because the current interation postion can't be changed.
        const UChar  *str = (const UChar *)ut->context;
        for (;;) {
            if (str[ut->chunkNativeLimit] == 0) {
                break;
            }
            ut->chunkNativeLimit++;
        }
        ut->a = ut->chunkNativeLimit;
        ut->chunkLength = (int32_t)ut->chunkNativeLimit;
        ut->nativeIndexingLimit = ut->chunkLength;
        ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
    }
    return ut->a;
}